

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O3

Vec_Int_t * Acb_NtkCollectTfoSideInputs(Acb_Ntk_t *p,int Pivot,Vec_Int_t *vTfo)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  Vec_Int_t *p_00;
  int *piVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar6 = (int *)malloc(400);
  p_00->pArray = piVar6;
  if ((p->vObjTrav).nSize < 1) {
    uVar1 = (p->vObjType).nCap;
    if ((p->vObjTrav).nCap < (int)uVar1) {
      piVar6 = (p->vObjTrav).pArray;
      if (piVar6 == (int *)0x0) {
        piVar6 = (int *)malloc((long)(int)uVar1 << 2);
      }
      else {
        piVar6 = (int *)realloc(piVar6,(long)(int)uVar1 << 2);
      }
      (p->vObjTrav).pArray = piVar6;
      if (piVar6 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (p->vObjTrav).nCap = uVar1;
    }
    if (0 < (int)uVar1) {
      memset((p->vObjTrav).pArray,0,(ulong)uVar1 * 4);
    }
    (p->vObjTrav).nSize = uVar1;
  }
  p->nObjTravs = p->nObjTravs + 1;
  Vec_IntPush(vTfo,Pivot);
  if (0 < vTfo->nSize) {
    piVar6 = vTfo->pArray;
    lVar8 = 0;
    do {
      iVar5 = piVar6[lVar8];
      if (((long)iVar5 < 0) || ((p->vObjTrav).nSize <= iVar5)) goto LAB_003a1b4a;
      (p->vObjTrav).pArray[iVar5] = p->nObjTravs;
      lVar8 = lVar8 + 1;
      uVar7 = (ulong)vTfo->nSize;
    } while (lVar8 < (long)uVar7);
    if (0 < vTfo->nSize) {
      lVar8 = 0;
      do {
        iVar5 = vTfo->pArray[lVar8];
        if ((long)iVar5 < 1) {
          __assert_fail("i>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                        ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
        }
        if ((p->vObjFans).nSize <= iVar5) {
LAB_003a1b4a:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar5 = (p->vObjFans).pArray[iVar5];
        lVar11 = (long)iVar5;
        if ((lVar11 < 0) || ((p->vFanSto).nSize <= iVar5)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        piVar6 = (p->vFanSto).pArray;
        if (0 < piVar6[lVar11]) {
          lVar10 = 0;
          do {
            iVar5 = piVar6[lVar11 + lVar10 + 1];
            lVar9 = (long)iVar5;
            if ((lVar9 < 0) || ((p->vObjTrav).nSize <= iVar5)) goto LAB_003a1b4a;
            piVar4 = (p->vObjTrav).pArray;
            iVar2 = piVar4[lVar9];
            iVar3 = p->nObjTravs;
            piVar4[lVar9] = iVar3;
            if ((iVar5 != Pivot) && (iVar2 != iVar3)) {
              Vec_IntPush(p_00,iVar5);
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 < piVar6[lVar11]);
          uVar7 = (ulong)(uint)vTfo->nSize;
        }
        lVar8 = lVar8 + 1;
        iVar5 = (int)uVar7;
      } while (lVar8 < iVar5);
      if (0 < iVar5) {
        vTfo->nSize = iVar5 + -1;
        return p_00;
      }
    }
  }
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
}

Assistant:

Vec_Int_t * Acb_NtkCollectTfoSideInputs( Acb_Ntk_t * p, int Pivot, Vec_Int_t * vTfo )
{
    Vec_Int_t * vSide  = Vec_IntAlloc( 100 );
    int i, k, Node, iFanin, * pFanins;
    Acb_NtkIncTravId( p );
    Vec_IntPush( vTfo, Pivot );
    Vec_IntForEachEntry( vTfo, Node, i )
        Acb_ObjSetTravIdCur( p, Node );
    Vec_IntForEachEntry( vTfo, Node, i )
        Acb_ObjForEachFaninFast( p, Node, pFanins, iFanin, k )
            if ( !Acb_ObjSetTravIdCur(p, iFanin) && iFanin != Pivot )
                Vec_IntPush( vSide, iFanin );
    Vec_IntPop( vTfo );
    return vSide;
}